

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O3

int udp_ep_get_remaddr(void *arg,void *v,size_t *szp,nni_opt_type t)

{
  int iVar1;
  udp_ep *ep;
  undefined1 local_b0 [8];
  nng_sockaddr sa;
  
  iVar1 = 9;
  if (*(char *)((long)arg + 1000) == '\x01') {
    memcpy((nng_sockaddr *)local_b0,(void *)((long)arg + 0x8e0),0x88);
    iVar1 = nni_copyout_sockaddr((nng_sockaddr *)local_b0,v,szp,t);
  }
  return iVar1;
}

Assistant:

static int
udp_ep_get_remaddr(void *arg, void *v, size_t *szp, nni_opt_type t)
{
	udp_ep      *ep = arg;
	int          rv;
	nng_sockaddr sa;

	if (!ep->dialer) {
		return (NNG_ENOTSUP);
	}
	sa = ep->peer_sa;

	rv = nni_copyout_sockaddr(&sa, v, szp, t);
	return (rv);
}